

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

bool __thiscall jpge::jpeg_encoder::process_end_of_image(jpeg_encoder *this)

{
  int i;
  ulong uVar1;
  
  uVar1 = (ulong)this->m_mcu_y_ofs;
  if (uVar1 != 0) {
    if (this->m_mcu_y_ofs < 0x10) {
      for (; (long)uVar1 < (long)this->m_mcu_y; uVar1 = uVar1 + 1) {
        memcpy(this->m_mcu_lines[uVar1],this->m_mcu_lines[(ulong)this->m_mcu_y_ofs - 1],
               (long)this->m_image_bpl_mcu);
      }
    }
    process_mcu_row(this);
  }
  if (this->m_pass_num == '\x01') {
    terminate_pass_one(this);
  }
  else {
    terminate_pass_two(this);
  }
  return true;
}

Assistant:

bool jpeg_encoder::process_end_of_image()
	{
		if (m_mcu_y_ofs)
		{
			if (m_mcu_y_ofs < 16) // check here just to shut up static analysis
			{
				for (int i = m_mcu_y_ofs; i < m_mcu_y; i++)
					memcpy(m_mcu_lines[i], m_mcu_lines[m_mcu_y_ofs - 1], m_image_bpl_mcu);
			}

			process_mcu_row();
		}

		if (m_pass_num == 1)
			return terminate_pass_one();
		else
			return terminate_pass_two();
	}